

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

char doBackslash(char c)

{
  char local_9;
  char c_local;
  
  switch(c) {
  case '\"':
    local_9 = '\"';
    break;
  default:
    local_9 = c;
    break;
  case '\'':
    local_9 = '\'';
    break;
  case '\\':
    local_9 = '\\';
    break;
  case 'a':
    local_9 = '\a';
    break;
  case 'b':
    local_9 = '\b';
    break;
  case 'f':
    local_9 = '\f';
    break;
  case 'n':
    local_9 = '\n';
    break;
  case 'r':
    local_9 = '\r';
    break;
  case 't':
    local_9 = '\t';
    break;
  case 'v':
    local_9 = '\v';
  }
  return local_9;
}

Assistant:

char doBackslash(char c) {
    switch (c) {
        case 't':
            return '\t';
        case 'n':
            return '\n';
        case 'a':
            return '\a';
        case 'b':
            return '\b';
        case 'r':
            return '\r';
        case 'v':
            return '\v';
        case 'f':
            return '\f';
        case '"':
            return '"';
        case '\\':
            return '\\';
        case '\'':
            return '\'';
        default:
            return c;
    }
}